

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

int nghttp2_stream_dep_insert(nghttp2_stream *dep_stream,nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_stream *stream_00;
  
  stream->sum_dep_weight = dep_stream->sum_dep_weight;
  dep_stream->sum_dep_weight = stream->weight;
  stream_00 = dep_stream->dep_next;
  if (stream_00 != (nghttp2_stream *)0x0) {
    do {
      stream_00->dep_prev = stream;
      if ((stream_00->queued != '\0') &&
         (iVar1 = stream_obq_move(stream,dep_stream,stream_00), iVar1 != 0)) {
        return iVar1;
      }
      stream_00 = stream_00->sib_next;
    } while (stream_00 != (nghttp2_stream *)0x0);
    if ((((stream->item != (nghttp2_outbound_item *)0x0) && ((stream->flags & 0xc) == 0)) ||
        (iVar1 = nghttp2_pq_empty(&stream->obq), iVar1 == 0)) &&
       (iVar1 = stream_obq_push(dep_stream,stream), iVar1 != 0)) {
      return iVar1;
    }
    stream->dep_next = dep_stream->dep_next;
  }
  dep_stream->dep_next = stream;
  stream->dep_prev = dep_stream;
  return 0;
}

Assistant:

int nghttp2_stream_dep_insert(nghttp2_stream *dep_stream,
                              nghttp2_stream *stream) {
  nghttp2_stream *si;
  int rv;

  DEBUGF("stream: dep_insert dep_stream(%p)=%d, stream(%p)=%d\n", dep_stream,
         dep_stream->stream_id, stream, stream->stream_id);

  stream->sum_dep_weight = dep_stream->sum_dep_weight;
  dep_stream->sum_dep_weight = stream->weight;

  if (dep_stream->dep_next) {
    for (si = dep_stream->dep_next; si; si = si->sib_next) {
      si->dep_prev = stream;
      if (si->queued) {
        rv = stream_obq_move(stream, dep_stream, si);
        if (rv != 0) {
          return rv;
        }
      }
    }

    if (stream_subtree_active(stream)) {
      rv = stream_obq_push(dep_stream, stream);
      if (rv != 0) {
        return rv;
      }
    }

    stream->dep_next = dep_stream->dep_next;
  }

  dep_stream->dep_next = stream;
  stream->dep_prev = dep_stream;

  validate_tree(stream);

  return 0;
}